

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzp.hpp
# Opt level: O0

uint32_t __thiscall mg::data::Mzp::MzpArchiveEntry::entry_data_size(MzpArchiveEntry *this)

{
  uint32_t size;
  uint32_t upper_bound_size_bytes;
  MzpArchiveEntry *this_local;
  
  return (this->size_sectors & 0x1fffe0) << 0xb | (uint)this->size_bytes;
}

Assistant:

uint32_t entry_data_size() const {
      // The `size` field is the raw 16 low 16 bits of the full size of the
      // entry in bytes. To get our total size, calculate the total number of
      // 2^16 bit pages that are part of this entry, then add on the least
      // significant bits
      const uint32_t upper_bound_size_bytes = size_sectors * SECTOR_SIZE;
      const uint32_t size = (upper_bound_size_bytes & ~(0xFFFF)) | size_bytes;
      return size;
    }